

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp,stbi__result_info *ri)

{
  char cVar1;
  long lVar2;
  byte bVar3;
  uint x;
  uint y;
  stbi_uc *psVar4;
  uchar *puVar5;
  byte *pbVar6;
  long lVar7;
  stbi_uc *psVar8;
  uint uVar9;
  byte *pbVar10;
  char *pcVar11;
  ulong uVar12;
  int iVar13;
  uint req_comp_00;
  byte *pbVar14;
  uint uVar15;
  uint uVar16;
  byte bVar17;
  int iVar18;
  uint uVar19;
  long *in_FS_OFFSET;
  bool bVar20;
  stbi_uc value [4];
  stbi__pic_packet packets [10];
  stbi_uc local_9c [4];
  stbi_uc *local_98;
  long local_90;
  int local_88;
  int local_84;
  ulong local_80;
  ulong local_78;
  long local_70;
  uint *local_68;
  uint *local_60;
  char local_57 [39];
  
  psVar4 = s->img_buffer;
  iVar13 = 0x5c;
  local_68 = (uint *)px;
  local_60 = (uint *)py;
  do {
    if (psVar4 < s->img_buffer_end) {
LAB_0013869f:
      psVar4 = psVar4 + 1;
      s->img_buffer = psVar4;
    }
    else if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar4 = s->img_buffer;
      goto LAB_0013869f;
    }
    iVar13 = iVar13 + -1;
  } while (iVar13 != 0);
  x = stbi__get16be(s);
  y = stbi__get16be(s);
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001386e0:
    if (s->img_buffer_end <= s->img_buffer) {
LAB_0013890a:
      lVar7 = *in_FS_OFFSET;
      pcVar11 = "bad file";
      goto LAB_00138947;
    }
  }
  else {
    iVar13 = (*(s->io).eof)(s->io_user_data);
    if (iVar13 != 0) {
      if (s->read_from_callbacks != 0) goto LAB_001386e0;
      goto LAB_0013890a;
    }
  }
  if ((y == 0) || ((x <= 0x7fffffff / y && (y * x < 0x20000000)))) {
    stbi__get16be(s);
    stbi__get16be(s);
    stbi__get16be(s);
    stbi__get16be(s);
    req_comp_00 = 0;
    puVar5 = (uchar *)stbi__malloc_mad3(x,y,4,0);
    if (puVar5 != (uchar *)0x0) {
      memset(puVar5,0xff,(ulong)(y * x * 4));
      pbVar14 = (byte *)(local_57 + 1);
      lVar7 = 0;
      do {
        if (lVar7 == 10) {
LAB_00138955:
          lVar7 = *in_FS_OFFSET;
          pcVar11 = "bad format";
LAB_0013897d:
          *(char **)(lVar7 + -0x20) = pcVar11;
LAB_00138997:
          free(puVar5);
          puVar5 = (uchar *)0x0;
          goto LAB_001389a3;
        }
        pbVar6 = s->img_buffer;
        pbVar10 = s->img_buffer_end;
        local_90 = lVar7;
        if (pbVar6 < pbVar10) {
LAB_001387d5:
          s->img_buffer = pbVar6 + 1;
          bVar20 = *pbVar6 == 0;
          pbVar6 = pbVar6 + 1;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar6 = s->img_buffer;
            pbVar10 = s->img_buffer_end;
            goto LAB_001387d5;
          }
          bVar20 = true;
        }
        if (pbVar6 < pbVar10) {
LAB_00138810:
          s->img_buffer = pbVar6 + 1;
          bVar3 = *pbVar6;
          pbVar6 = pbVar6 + 1;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar6 = s->img_buffer;
            pbVar10 = s->img_buffer_end;
            goto LAB_00138810;
          }
          bVar3 = 0;
        }
        pbVar14[-2] = bVar3;
        if (pbVar6 < pbVar10) {
LAB_0013884b:
          s->img_buffer = pbVar6 + 1;
          bVar17 = *pbVar6;
          pbVar6 = pbVar6 + 1;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar6 = s->img_buffer;
            pbVar10 = s->img_buffer_end;
            goto LAB_0013884b;
          }
          bVar17 = 0;
        }
        pbVar14[-1] = bVar17;
        if (pbVar6 < pbVar10) {
LAB_0013887d:
          s->img_buffer = pbVar6 + 1;
          bVar17 = *pbVar6;
          pbVar6 = pbVar6 + 1;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar6 = s->img_buffer;
            goto LAB_0013887d;
          }
          bVar17 = 0;
        }
        *pbVar14 = bVar17;
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001388b7:
          if (pbVar6 < s->img_buffer_end) goto LAB_001388c4;
LAB_0013896a:
          lVar7 = *in_FS_OFFSET;
          pcVar11 = "bad file";
          goto LAB_0013897d;
        }
        iVar13 = (*(s->io).eof)(s->io_user_data);
        if (iVar13 != 0) {
          if (s->read_from_callbacks != 0) {
            pbVar6 = s->img_buffer;
            goto LAB_001388b7;
          }
          goto LAB_0013896a;
        }
LAB_001388c4:
        if (bVar3 != 8) goto LAB_00138955;
        req_comp_00 = req_comp_00 | bVar17;
        pbVar14 = pbVar14 + 3;
        lVar7 = local_90 + 1;
      } while (!bVar20);
      req_comp_00 = 4 - ((req_comp_00 & 0x10) == 0);
      if (comp != (int *)0x0) {
        *comp = req_comp_00;
      }
      if (y != 0) {
        local_84 = x * 4;
        local_80 = (ulong)y;
        uVar12 = 0;
        local_90 = lVar7;
        do {
          local_98 = puVar5 + local_84 * (int)uVar12;
          lVar7 = 0;
          local_78 = uVar12;
          do {
            lVar2 = lVar7 * 3;
            cVar1 = local_57[lVar2];
            local_70 = lVar7;
            if (cVar1 == '\0') {
              if (x != 0) {
                bVar3 = local_57[lVar2 + 1];
                psVar4 = local_98;
                uVar19 = x;
                do {
                  psVar8 = stbi__readval(s,(uint)bVar3,psVar4);
                  if (psVar8 == (stbi_uc *)0x0) goto LAB_00138997;
                  psVar4 = psVar4 + 4;
                  uVar19 = uVar19 - 1;
                } while (uVar19 != 0);
              }
            }
            else if (cVar1 == '\x01') {
              psVar4 = local_98;
              uVar19 = x;
              if (x != 0) {
                do {
                  pbVar14 = s->img_buffer;
                  if (pbVar14 < s->img_buffer_end) {
LAB_00138c13:
                    s->img_buffer = pbVar14 + 1;
                    bVar3 = *pbVar14;
                    pbVar14 = pbVar14 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar14 = s->img_buffer;
                      goto LAB_00138c13;
                    }
                    bVar3 = 0;
                  }
                  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00138c49:
                    if (s->img_buffer_end <= pbVar14) {
LAB_00138d3f:
                      *(char **)(*in_FS_OFFSET + -0x20) = "bad file";
                      goto LAB_00138997;
                    }
                  }
                  else {
                    iVar13 = (*(s->io).eof)(s->io_user_data);
                    if (iVar13 != 0) {
                      if (s->read_from_callbacks != 0) {
                        pbVar14 = s->img_buffer;
                        goto LAB_00138c49;
                      }
                      goto LAB_00138d3f;
                    }
                  }
                  psVar8 = stbi__readval(s,(uint)(byte)local_57[lVar2 + 1],local_9c);
                  if (psVar8 == (stbi_uc *)0x0) goto LAB_00138997;
                  if (uVar19 < bVar3) {
                    bVar3 = (byte)uVar19;
                  }
                  uVar16 = (uint)bVar3;
                  if (bVar3 != 0) {
                    uVar9 = 0;
                    do {
                      bVar3 = local_57[lVar2 + 1];
                      uVar15 = 0x80;
                      lVar7 = 0;
                      do {
                        if ((uVar15 & bVar3) != 0) {
                          psVar4[lVar7] = local_9c[lVar7];
                        }
                        lVar7 = lVar7 + 1;
                        uVar15 = uVar15 >> 1;
                      } while (lVar7 != 4);
                      uVar9 = uVar9 + 1;
                      psVar4 = psVar4 + 4;
                    } while (uVar9 != uVar16);
                  }
                  uVar9 = uVar19 - uVar16;
                  bVar20 = (int)uVar16 <= (int)uVar19;
                  uVar19 = uVar9;
                } while (uVar9 != 0 && bVar20);
              }
            }
            else {
              if (cVar1 != '\x02') {
                *(char **)(*in_FS_OFFSET + -0x20) = "bad format";
                goto LAB_00138997;
              }
              psVar4 = local_98;
              uVar19 = x;
              if (x != 0) {
                do {
                  pbVar14 = s->img_buffer;
                  if (pbVar14 < s->img_buffer_end) {
LAB_00138ac2:
                    s->img_buffer = pbVar14 + 1;
                    bVar3 = *pbVar14;
                    pbVar14 = pbVar14 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar14 = s->img_buffer;
                      goto LAB_00138ac2;
                    }
                    bVar3 = 0;
                  }
                  if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
                    iVar13 = (*(s->io).eof)(s->io_user_data);
                    if (iVar13 == 0) goto LAB_00138b0a;
                    if (s->read_from_callbacks != 0) {
                      pbVar14 = s->img_buffer;
                      goto LAB_00138afd;
                    }
LAB_00138d69:
                    *(char **)(*in_FS_OFFSET + -0x20) = "bad file";
                    goto LAB_00138997;
                  }
LAB_00138afd:
                  if (s->img_buffer_end <= pbVar14) goto LAB_00138d69;
LAB_00138b0a:
                  uVar16 = (uint)bVar3;
                  if ((char)bVar3 < '\0') {
                    if (uVar16 == 0x80) {
                      iVar13 = stbi__get16be(s);
                    }
                    else {
                      iVar13 = uVar16 - 0x7f;
                    }
                    if ((int)uVar19 < iVar13) goto LAB_00138d69;
                    psVar8 = stbi__readval(s,(uint)(byte)local_57[lVar2 + 1],local_9c);
                    if (psVar8 == (stbi_uc *)0x0) goto LAB_00138997;
                    if (0 < iVar13) {
                      iVar18 = 0;
                      do {
                        bVar3 = local_57[lVar2 + 1];
                        uVar16 = 0x80;
                        lVar7 = 0;
                        do {
                          if ((uVar16 & bVar3) != 0) {
                            psVar4[lVar7] = local_9c[lVar7];
                          }
                          lVar7 = lVar7 + 1;
                          uVar16 = uVar16 >> 1;
                        } while (lVar7 != 4);
                        iVar18 = iVar18 + 1;
                        psVar4 = psVar4 + 4;
                      } while (iVar18 != iVar13);
                    }
                  }
                  else {
                    iVar18 = uVar16 + 1;
                    local_88 = iVar18;
                    if (uVar19 <= uVar16) goto LAB_00138d69;
                    do {
                      psVar8 = stbi__readval(s,(uint)(byte)local_57[lVar2 + 1],psVar4);
                      if (psVar8 == (stbi_uc *)0x0) goto LAB_00138997;
                      psVar4 = psVar4 + 4;
                      iVar18 = iVar18 + -1;
                      iVar13 = local_88;
                    } while (iVar18 != 0);
                  }
                  uVar16 = uVar19 - iVar13;
                  bVar20 = iVar13 <= (int)uVar19;
                  uVar19 = uVar16;
                } while (uVar16 != 0 && bVar20);
              }
            }
            lVar7 = local_70 + 1;
          } while (local_90 != lVar7);
          uVar12 = local_78 + 1;
        } while (uVar12 != local_80);
      }
LAB_001389a3:
      *local_68 = x;
      *local_60 = y;
      if (req_comp != 0) {
        req_comp_00 = req_comp;
      }
      if (req_comp == 0 && comp != (int *)0x0) {
        req_comp_00 = *comp;
      }
      puVar5 = stbi__convert_format(puVar5,4,req_comp_00,x,y);
      return puVar5;
    }
    lVar7 = *in_FS_OFFSET;
    pcVar11 = "outofmem";
  }
  else {
    lVar7 = *in_FS_OFFSET;
    pcVar11 = "too large";
  }
LAB_00138947:
  *(char **)(lVar7 + -0x20) = pcVar11;
  return (void *)0x0;
}

Assistant:

static void *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp, stbi__result_info *ri)
{
   stbi_uc *result;
   int i, x,y, internal_comp;
   STBI_NOTUSED(ri);

   if (!comp) comp = &internal_comp;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);

   if (y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if (!stbi__mad3sizes_valid(x, y, 4, 0)) return stbi__errpuc("too large", "PIC image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc_mad3(x, y, 4, 0);
   if (!result) return stbi__errpuc("outofmem", "Out of memory");
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}